

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall FIX::CharField::CharField(CharField *this,int field,char data)

{
  string local_38;
  char local_15;
  int local_14;
  char data_local;
  CharField *pCStack_10;
  int field_local;
  CharField *this_local;
  
  local_15 = data;
  local_14 = field;
  pCStack_10 = this;
  CharConvertor::convert_abi_cxx11_(&local_38,(CharConvertor *)(ulong)(uint)(int)data,data);
  FieldBase::FieldBase(&this->super_FieldBase,field,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_FieldBase)._vptr_FieldBase = (_func_int **)&PTR__CharField_001b1410;
  return;
}

Assistant:

explicit CharField( int field, char data )
: FieldBase( field, CharConvertor::convert( data ) ) {}